

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O3

int xreq0_pipe_start(void *arg)

{
  undefined8 *puVar1;
  uint16_t uVar2;
  int iVar3;
  
  puVar1 = *(undefined8 **)((long)arg + 8);
  uVar2 = nni_pipe_peer(*arg);
  if (uVar2 == 0x31) {
    nni_msgq_aio_get((nni_msgq *)*puVar1,(nni_aio *)((long)arg + 0x10));
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x3a0));
    iVar3 = 0;
  }
  else {
    uVar2 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar2,0x31
                );
    iVar3 = 0xd;
  }
  return iVar3;
}

Assistant:

static int
xreq0_pipe_start(void *arg)
{
	xreq0_pipe *p = arg;
	xreq0_sock *s = p->req;

	if (nni_pipe_peer(p->pipe) != REQ0_PEER) {
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), REQ0_PEER);
		return (NNG_EPROTO);
	}

	nni_msgq_aio_get(s->uwq, &p->aio_getq);
	nni_pipe_recv(p->pipe, &p->aio_recv);
	return (0);
}